

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# struct_packing_pass.cpp
# Opt level: O2

vector<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
* __thiscall
spvtools::opt::StructPackingPass::findStructMemberTypes
          (vector<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
           *__return_storage_ptr__,StructPackingPass *this,Instruction *structDef)

{
  uint32_t id;
  Operand *this_00;
  TypeManager *this_01;
  Type *pTVar1;
  int iVar2;
  ulong __new_size;
  ulong uVar3;
  
  iVar2 = (int)(((long)(structDef->operands_).
                       super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                (long)(structDef->operands_).
                      super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                      ._M_impl.super__Vector_impl_data._M_start) / 0x30);
  if (iVar2 != 0) {
    __new_size = (ulong)(iVar2 - 1);
    (__return_storage_ptr__->
    super__Vector_base<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
    )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
    )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
    )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::
    vector<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
    ::resize(__return_storage_ptr__,__new_size);
    for (uVar3 = 0; __new_size != uVar3; uVar3 = uVar3 + 1) {
      this_00 = Instruction::GetOperand(structDef,(int)uVar3 + 1);
      id = Operand::AsId(this_00);
      this_01 = IRContext::get_type_mgr((this->super_Pass).context_);
      pTVar1 = analysis::TypeManager::GetType(this_01,id);
      if (pTVar1 != (Type *)0x0) {
        (__return_storage_ptr__->
        super__Vector_base<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
        )._M_impl.super__Vector_impl_data._M_start[uVar3] = pTVar1;
      }
    }
    return __return_storage_ptr__;
  }
  __assert_fail("structDef.NumOperands() > 0 && \"Number of operands in OpTypeStruct instruction must not be zero\""
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/struct_packing_pass.cpp"
                ,0x18b,
                "std::vector<const analysis::Type *> spvtools::opt::StructPackingPass::findStructMemberTypes(const Instruction &) const"
               );
}

Assistant:

std::vector<const analysis::Type*> StructPackingPass::findStructMemberTypes(
    const Instruction& structDef) const {
  // Found struct type to pack, now collect all types of its members
  assert(structDef.NumOperands() > 0 &&
         "Number of operands in OpTypeStruct instruction must not be zero");
  const uint32_t numMembers = structDef.NumOperands() - 1;
  std::vector<const analysis::Type*> structMemberTypes;
  structMemberTypes.resize(numMembers);
  for (uint32_t i = 0; i < numMembers; ++i) {
    const spv::Id memberTypeId = structDef.GetOperand(1 + i).AsId();
    if (const analysis::Type* memberType =
            context()->get_type_mgr()->GetType(memberTypeId)) {
      structMemberTypes[i] = memberType;
    }
  }
  return structMemberTypes;
}